

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

bool __thiscall
Clasp::Cli::ClaspAppBase::handlePostGroundOptions(ClaspAppBase *this,ProgramBuilder *prg)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t in_RCX;
  uint uVar4;
  ProgramReader *this_00;
  LemmaLogger *this_01;
  ofstream null;
  
  cVar1 = (this->claspAppOpts_).onlyPre;
  if (cVar1 == '\0') {
    this_00 = (ProgramReader *)((this->lemmaIn_).ptr_ & 0xfffffffffffffffe);
    if (this_00 != (ProgramReader *)0x0) {
      Potassco::ProgramReader::parse(this_00,Incremental);
    }
    this_01 = (LemmaLogger *)((this->logger_).ptr_ & 0xfffffffffffffffe);
    if (this_01 != (LemmaLogger *)0x0) {
      bVar2 = ClaspFacade::incremental((ClaspFacade *)((this->clasp_).ptr_ & 0xfffffffffffffffe));
      LemmaLogger::startStep(this_01,prg,bVar2);
    }
  }
  else {
    ProgramBuilder::endProgram(prg);
    iVar3 = (*prg->_vptr_ProgramBuilder[8])(prg);
    if (iVar3 == 2) {
      uVar4 = (uint)(this->claspAppOpts_).onlyPre;
      if (uVar4 == 0xffffffff) {
        bVar2 = Asp::LogicProgram::supportsSmodels((LogicProgram *)prg);
        if (!bVar2) {
          std::ofstream::ofstream(&null);
          AspParser::write((AspParser *)prg,(int)&null,(void *)0xffffffffffffffff,in_RCX);
          std::ofstream::~ofstream(&null);
        }
      }
      AspParser::write((AspParser *)prg,0x1ee368,(void *)(ulong)uVar4,in_RCX);
    }
    else {
      (*(this->super_Application)._vptr_Application[6])
                (this,"Option \'--pre\': unsupported input format!");
      Potassco::Application::setExitCode(&this->super_Application,0x41);
    }
  }
  return cVar1 == '\0';
}

Assistant:

bool ClaspAppBase::handlePostGroundOptions(ProgramBuilder& prg) {
	if (!claspAppOpts_.onlyPre) {
		if (lemmaIn_.get()) { lemmaIn_->parse(); }
		if (logger_.get())  { logger_->startStep(prg, clasp_->incremental()); }
		return true;
	}
	prg.endProgram();
	if (prg.type() == Problem_t::Asp) {
		Asp::LogicProgram& asp = static_cast<Asp::LogicProgram&>(prg);
		AspParser::Format outf = static_cast<AspParser::Format>(claspAppOpts_.onlyPre);
		if (outf == AspParser::format_smodels && !asp.supportsSmodels()) {
			std::ofstream null;
			try { AspParser::write(asp, null, outf); }
			catch (const std::logic_error& e) {
				error("Option '--pre': unsupported input format!");
				info(std::string(e.what()).append(" in 'smodels' format").c_str());
				info("Try '--pre=aspif' to print in 'aspif' format");
				setExitCode(E_ERROR);
				return false;
			}
		}
		AspParser::write(asp, std::cout, outf);
	}
	else {
		error("Option '--pre': unsupported input format!");
		setExitCode(E_ERROR);
	}
	return false;
}